

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int lj_cf_debug_getinfo(lua_State *L)

{
  uint uVar1;
  int iVar2;
  lua_State *L_00;
  lua_Debug *ar_00;
  lua_State *in_RDI;
  char *options;
  lua_State *L1;
  int opt_L;
  int opt_f;
  int arg;
  lj_Debug ar;
  lua_State *in_stack_fffffffffffffed8;
  lua_State *in_stack_fffffffffffffee0;
  size_t *in_stack_fffffffffffffee8;
  lua_State *plVar3;
  undefined4 in_stack_fffffffffffffef8;
  int idx;
  int iVar4;
  int in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff94;
  lj_Debug *in_stack_ffffffffffffff98;
  TValue *in_stack_ffffffffffffffa0;
  lua_State *in_stack_ffffffffffffffa8;
  
  iVar4 = 0;
  idx = 0;
  L_00 = getthread(in_RDI,(int *)&stack0xffffffffffffff04);
  ar_00 = (lua_Debug *)
          luaL_optlstring((lua_State *)CONCAT44(in_stack_ffffffffffffff04,iVar4),idx,(char *)L_00,
                          in_stack_fffffffffffffee8);
  iVar2 = lua_isnumber(L_00,(int)((ulong)ar_00 >> 0x20));
  plVar3 = L_00;
  if (iVar2 == 0) {
    if ((in_RDI->top <= in_RDI->base + in_stack_ffffffffffffff04) ||
       (*(int *)((long)in_RDI->base + (long)in_stack_ffffffffffffff04 * 8 + 4) != -9)) {
      lj_err_arg(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                 (ErrMsg)in_stack_fffffffffffffed8);
    }
    ar_00 = (lua_Debug *)lua_pushfstring(in_RDI,">%s",ar_00);
    in_stack_ffffffffffffffa0 = plVar3->top;
    plVar3->top = in_stack_ffffffffffffffa0 + 1;
    uVar1 = in_RDI->base[in_stack_ffffffffffffff04].u32.lo;
    in_stack_ffffffffffffff98 = (lj_Debug *)(ulong)uVar1;
    (in_stack_ffffffffffffffa0->u32).lo = uVar1;
    (in_stack_ffffffffffffffa0->field_2).it = 0xfffffff7;
    L_00 = in_stack_fffffffffffffee0;
    in_stack_ffffffffffffffa8 = plVar3;
  }
  else {
    lua_tointeger((lua_State *)CONCAT44(idx,in_stack_fffffffffffffef8),(int)((ulong)L_00 >> 0x20));
    iVar2 = lua_getstack((lua_State *)CONCAT44(idx,in_stack_fffffffffffffef8),
                         (int)((ulong)plVar3 >> 0x20),ar_00);
    if (iVar2 == 0) {
      *(undefined4 *)((long)in_RDI->top + -4) = 0xffffffff;
      return 1;
    }
  }
  iVar2 = lj_debug_getinfo(in_stack_ffffffffffffffa8,(char *)&in_stack_ffffffffffffffa0->u64,
                           in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  if (iVar2 != 0) {
    lua_createtable((lua_State *)CONCAT44(idx,in_stack_fffffffffffffef8),
                    (int)((ulong)plVar3 >> 0x20),(int)plVar3);
    for (; (char)ar_00->event != '\0'; ar_00 = (lua_Debug *)((long)&ar_00->event + 1)) {
      in_stack_fffffffffffffed8 = (lua_State *)(ulong)((int)(char)ar_00->event - 0x4c);
      switch(in_stack_fffffffffffffed8) {
      case (lua_State *)0x0:
        idx = 1;
        break;
      default:
        break;
      case (lua_State *)0x7:
        settabss(L_00,(char *)in_stack_fffffffffffffed8,(char *)0x13c835);
        settabss(L_00,(char *)in_stack_fffffffffffffed8,(char *)0x13c852);
        settabsi(L_00,(char *)in_stack_fffffffffffffed8,0);
        settabsi(L_00,(char *)in_stack_fffffffffffffed8,0);
        settabss(L_00,(char *)in_stack_fffffffffffffed8,(char *)0x13c89b);
        break;
      case (lua_State *)0x1a:
        iVar4 = 1;
        break;
      case (lua_State *)0x20:
        settabsi(L_00,(char *)in_stack_fffffffffffffed8,0);
        break;
      case (lua_State *)0x22:
        settabss(L_00,(char *)in_stack_fffffffffffffed8,(char *)0x13c926);
        settabss(L_00,(char *)in_stack_fffffffffffffed8,(char *)0x13c93f);
        break;
      case (lua_State *)0x29:
        settabsi(L_00,(char *)in_stack_fffffffffffffed8,0);
        settabsi(L_00,(char *)in_stack_fffffffffffffed8,0);
        settabsb(L_00,(char *)in_stack_fffffffffffffed8,0);
      }
    }
    if (idx != 0) {
      treatstackoption(L_00,in_stack_fffffffffffffed8,(char *)0x13c98c);
    }
    if (iVar4 != 0) {
      treatstackoption(L_00,in_stack_fffffffffffffed8,(char *)0x13c9ac);
    }
    return 1;
  }
  lj_err_arg(L_00,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(ErrMsg)in_stack_fffffffffffffed8)
  ;
}

Assistant:

LJLIB_CF(debug_getinfo)
{
  lj_Debug ar;
  int arg, opt_f = 0, opt_L = 0;
  lua_State *L1 = getthread(L, &arg);
  const char *options = luaL_optstring(L, arg+2, "flnSu");
  if (lua_isnumber(L, arg+1)) {
    if (!lua_getstack(L1, (int)lua_tointeger(L, arg+1), (lua_Debug *)&ar)) {
      setnilV(L->top-1);
      return 1;
    }
  } else if (L->base+arg < L->top && tvisfunc(L->base+arg)) {
    options = lua_pushfstring(L, ">%s", options);
    setfuncV(L1, L1->top++, funcV(L->base+arg));
  } else {
    lj_err_arg(L, arg+1, LJ_ERR_NOFUNCL);
  }
  if (!lj_debug_getinfo(L1, options, &ar, 1))
    lj_err_arg(L, arg+2, LJ_ERR_INVOPT);
  lua_createtable(L, 0, 16);  /* Create result table. */
  for (; *options; options++) {
    switch (*options) {
    case 'S':
      settabss(L, "source", ar.source);
      settabss(L, "short_src", ar.short_src);
      settabsi(L, "linedefined", ar.linedefined);
      settabsi(L, "lastlinedefined", ar.lastlinedefined);
      settabss(L, "what", ar.what);
      break;
    case 'l':
      settabsi(L, "currentline", ar.currentline);
      break;
    case 'u':
      settabsi(L, "nups", ar.nups);
      settabsi(L, "nparams", ar.nparams);
      settabsb(L, "isvararg", ar.isvararg);
      break;
    case 'n':
      settabss(L, "name", ar.name);
      settabss(L, "namewhat", ar.namewhat);
      break;
    case 'f': opt_f = 1; break;
    case 'L': opt_L = 1; break;
    default: break;
    }
  }
  if (opt_L) treatstackoption(L, L1, "activelines");
  if (opt_f) treatstackoption(L, L1, "func");
  return 1;  /* Return result table. */
}